

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O1

bool __thiscall QEvdevKeyboardHandler::loadKeymap(QEvdevKeyboardHandler *this,QString *file)

{
  char cVar1;
  undefined8 uVar2;
  QDataStream *pQVar3;
  Mapping *pMVar4;
  Composing *pCVar5;
  bool bVar6;
  Mapping *pMVar7;
  Composing *pCVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  quint32 qmap_keycompose_size;
  quint32 qmap_keymap_size;
  quint32 qmap_version;
  quint32 qmap_magic;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar2 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Loading keymap %ls",uVar2);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,file);
  cVar1 = QFile::open((QFile *)&local_68,1);
  if (cVar1 == '\0') {
    loadKeymap();
    bVar6 = false;
    goto LAB_0012645c;
  }
  local_6c = -0x55555556;
  local_70 = -0x55555556;
  local_74 = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_48 = 0xaaaaaaaa;
  local_44 = 0xaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,(QIODevice *)&local_68);
  pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,&local_6c);
  pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,&local_70);
  pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(int *)&local_74);
  QDataStream::operator>>(pQVar3,(int *)&local_78);
  if ((((uStack_48._3_1_ == '\0') && (local_6c == 0x514d4150)) && (local_70 == 1)) &&
     (local_74 != 0)) {
    pMVar4 = (Mapping *)operator_new__((ulong)local_74 * 0xc);
    if ((ulong)local_78 == 0) {
      pCVar5 = (Composing *)0x0;
    }
    else {
      pCVar5 = (Composing *)operator_new__((ulong)local_78 * 6);
    }
    if (local_74 != 0) {
      uVar9 = 0;
      pMVar7 = pMVar4;
      do {
        pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,(short *)pMVar7);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(short *)&pMVar7->unicode);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(int *)&pMVar7->qtcode);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(signed *)&pMVar7->modifiers);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(signed *)&pMVar7->flags);
        QDataStream::operator>>(pQVar3,(short *)&pMVar7->special);
        uVar9 = uVar9 + 1;
        pMVar7 = pMVar7 + 1;
      } while (uVar9 < local_74);
    }
    if (local_78 != 0) {
      uVar9 = 0;
      pCVar8 = pCVar5;
      do {
        pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,(short *)pCVar8);
        pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(short *)&pCVar8->second);
        QDataStream::operator>>(pQVar3,(short *)&pCVar8->result);
        uVar9 = uVar9 + 1;
        pCVar8 = pCVar8 + 1;
      } while (uVar9 < local_78);
    }
    if (uStack_48._3_1_ != '\0') {
      loadKeymap();
      goto LAB_001264af;
    }
    unloadKeymap(this);
    this->m_keymap = pMVar4;
    this->m_keymap_size = local_74;
    this->m_keycompose = pCVar5;
    this->m_keycompose_size = local_78;
    this->m_do_compose = true;
    bVar6 = true;
  }
  else {
    loadKeymap();
LAB_001264af:
    bVar6 = false;
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
LAB_0012645c:
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QEvdevKeyboardHandler::loadKeymap(const QString &file)
{
    qCDebug(qLcEvdevKey, "Loading keymap %ls", qUtf16Printable(file));

    QFile f(file);

    if (!f.open(QIODevice::ReadOnly)) {
        qWarning("Could not open keymap file '%ls'", qUtf16Printable(file));
        return false;
    }

    // .qmap files have a very simple structure:
    // quint32 magic           (QKeyboard::FileMagic)
    // quint32 version         (1)
    // quint32 keymap_size     (# of struct QKeyboard::Mappings)
    // quint32 keycompose_size (# of struct QKeyboard::Composings)
    // all QKeyboard::Mappings via QDataStream::operator(<<|>>)
    // all QKeyboard::Composings via QDataStream::operator(<<|>>)

    quint32 qmap_magic, qmap_version, qmap_keymap_size, qmap_keycompose_size;

    QDataStream ds(&f);

    ds >> qmap_magic >> qmap_version >> qmap_keymap_size >> qmap_keycompose_size;

    if (ds.status() != QDataStream::Ok || qmap_magic != QKeyboardMap::FileMagic || qmap_version != 1 || qmap_keymap_size == 0) {
        qWarning("'%ls' is not a valid .qmap keymap file", qUtf16Printable(file));
        return false;
    }

    QKeyboardMap::Mapping *qmap_keymap = new QKeyboardMap::Mapping[qmap_keymap_size];
    QKeyboardMap::Composing *qmap_keycompose = qmap_keycompose_size ? new QKeyboardMap::Composing[qmap_keycompose_size] : 0;

    for (quint32 i = 0; i < qmap_keymap_size; ++i)
        ds >> qmap_keymap[i];
    for (quint32 i = 0; i < qmap_keycompose_size; ++i)
        ds >> qmap_keycompose[i];

    if (ds.status() != QDataStream::Ok) {
        delete [] qmap_keymap;
        delete [] qmap_keycompose;

        qWarning("Keymap file '%ls' cannot be loaded.", qUtf16Printable(file));
        return false;
    }

    // unload currently active and clear state
    unloadKeymap();

    m_keymap = qmap_keymap;
    m_keymap_size = qmap_keymap_size;
    m_keycompose = qmap_keycompose;
    m_keycompose_size = qmap_keycompose_size;

    m_do_compose = true;

    return true;
}